

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampler.c
# Opt level: O0

int resampler_run_blam_sse(resampler *r,float **out_,float *out_end)

{
  float fVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  float *pfVar9;
  undefined8 *puVar10;
  ulong in_RDX;
  long *in_RSI;
  int *in_RDI;
  float fVar11;
  float kernel_sum;
  double sample;
  int window_step;
  int step;
  bigint inv_phase_inc;
  bigint inv_phase;
  bigint phase_inc;
  bigint phase;
  double last_amp;
  float *in_end;
  float *in;
  float *out;
  int used;
  float *in_;
  int in_size;
  float local_1e8;
  int local_1dc;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  float local_198 [2];
  undefined8 auStack_190 [16];
  float local_10c;
  double local_108;
  ulong local_f0;
  ulong local_e0;
  double local_d8;
  float *local_c8;
  long local_c0;
  int local_b4;
  int window_pos;
  int pos;
  int i;
  int phase_adj;
  int phase_reduced;
  float *kernelf;
  __m128 samplex;
  __m128 temp2;
  __m128 temp1;
  
  iVar2 = in_RDI[1];
  pfVar9 = (float *)(in_RDI + (long)*in_RDI + (0x52 - (long)in_RDI[1]));
  local_b4 = 0;
  if (0 < iVar2 + -2) {
    local_c0 = *in_RSI;
    local_d8 = *(double *)(in_RDI + 0xe);
    local_e0 = *(ulong *)(in_RDI + 4);
    uVar3 = *(ulong *)(in_RDI + 6);
    local_f0 = *(ulong *)(in_RDI + 8);
    uVar4 = *(ulong *)(in_RDI + 10);
    local_c8 = pfVar9;
    do {
      if (in_RDX < local_c0 + 0x80U) break;
      local_108 = (double)*local_c8;
      if (uVar3 < 0x100000000) {
        local_1e8 = (float)local_e0;
        local_108 = (double)((local_c8[1] - *local_c8) * local_1e8 * 2.3283064e-10) + local_108;
      }
      local_108 = local_108 - local_d8;
      if ((local_108 != 0.0) || (NAN(local_108))) {
        local_10c = 0.0;
        iVar7 = (int)(local_f0 >> 0x16);
        for (local_1dc = 0x10; -0x10 < local_1dc; local_1dc = local_1dc + -1) {
          iVar8 = (iVar7 * 0x3b8) / 0x400 + local_1dc * -0x3b8;
          if (iVar8 < 1) {
            iVar8 = -iVar8;
          }
          fVar11 = sinc_lut[iVar8];
          iVar8 = iVar7 + local_1dc * -0x400;
          if (iVar8 < 1) {
            iVar8 = -iVar8;
          }
          fVar1 = window_lut[iVar8];
          *(float *)((long)auStack_190 + (long)(local_1dc + 0xf) * 4 + -8) = fVar11 * fVar1;
          local_10c = fVar11 * fVar1 + local_10c;
        }
        local_d8 = local_d8 + local_108;
        fVar11 = (float)(local_108 / (double)local_10c);
        for (local_1dc = 0; local_1dc < 8; local_1dc = local_1dc + 1) {
          kernelf._0_4_ = (float)auStack_190[(long)local_1dc * 2 + -1];
          kernelf._4_4_ = (float)((ulong)auStack_190[(long)local_1dc * 2 + -1] >> 0x20);
          samplex[0] = (float)auStack_190[(long)local_1dc * 2];
          samplex[1] = (float)((ulong)auStack_190[(long)local_1dc * 2] >> 0x20);
          puVar10 = (undefined8 *)(local_c0 + (long)(local_1dc << 2) * 4);
          uVar5 = *puVar10;
          uVar6 = puVar10[1];
          temp2[2] = (float)uVar5;
          temp2[3] = (float)((ulong)uVar5 >> 0x20);
          temp1[0] = (float)uVar6;
          temp1[1] = (float)((ulong)uVar6 >> 0x20);
          local_1a8 = CONCAT44(kernelf._4_4_ * fVar11 + temp2[3],kernelf._0_4_ * fVar11 + temp2[2]);
          uStack_1a0 = CONCAT44(samplex[1] * fVar11 + temp1[1],samplex[0] * fVar11 + temp1[0]);
          puVar10 = (undefined8 *)(local_c0 + (long)(local_1dc << 2) * 4);
          *puVar10 = local_1a8;
          puVar10[1] = uStack_1a0;
        }
      }
      if (uVar4 < 0x100000000) {
        local_c8 = local_c8 + 1;
        local_f0 = uVar4 + local_f0;
        local_c0 = (local_f0 >> 0x20) * 4 + local_c0;
        local_f0 = local_f0 & 0xffffffff;
      }
      else {
        local_e0 = uVar3 + local_e0;
        local_c0 = local_c0 + 4;
        if (0xffffffff < local_e0) {
          local_c8 = local_c8 + 1;
          local_e0 = local_e0 & 0xffffffff;
        }
      }
    } while (local_c8 < pfVar9 + (iVar2 + -2));
    *(ulong *)(in_RDI + 4) = local_e0;
    *(ulong *)(in_RDI + 8) = local_f0;
    *(double *)(in_RDI + 0xe) = local_d8;
    *in_RSI = local_c0;
    local_b4 = (int)((long)local_c8 - (long)pfVar9 >> 2);
    in_RDI[1] = in_RDI[1] - local_b4;
  }
  return local_b4;
}

Assistant:

static int resampler_run_blam_sse(resampler * r, float ** out_, float * out_end)
{
    int in_size = r->write_filled;
    float const* in_ = r->buffer_in + resampler_buffer_size + r->write_pos - r->write_filled;
    int used = 0;
    in_size -= 2;
    if ( in_size > 0 )
    {
        float* out = *out_;
        float const* in = in_;
        float const* const in_end = in + in_size;
        double last_amp = r->last_amp;
        bigint phase = r->phase;
        bigint phase_inc = r->phase_inc;
        bigint inv_phase = r->inv_phase;
        bigint inv_phase_inc = r->inv_phase_inc;

        const int step = (int)(RESAMPLER_BLAM_CUTOFF * RESAMPLER_RESOLUTION);
        const int window_step = RESAMPLER_RESOLUTION;

        do
        {
            double sample;
            
            if ( out + SINC_WIDTH * 2 > out_end )
                break;

            sample = in[0];
            if (phase_inc.quad < 0x100000000ll)
            {
                sample += (in[1] - in[0]) * phase.quad * (1.f / 0x100000000ll);
            }
            sample -= last_amp;
            
            if (sample)
            {
                float kernel_sum = 0.0f;
                __m128 kernel[SINC_WIDTH / 2];
                __m128 temp1, temp2;
                __m128 samplex;
                float *kernelf = (float*)(&kernel);
				int phase_reduced = PHASE_REDUCE(inv_phase);
                int phase_adj = phase_reduced * step / RESAMPLER_RESOLUTION;
                int i = SINC_WIDTH;

                for (; i >= -SINC_WIDTH + 1; --i)
                {
                    int pos = i * step;
                    int window_pos = i * window_step;
                    kernel_sum += kernelf[i + SINC_WIDTH - 1] = sinc_lut[abs(phase_adj - pos)] * window_lut[abs(phase_reduced - window_pos)];
                }
                last_amp += sample;
                sample /= kernel_sum;
                samplex = _mm_set1_ps( (float)sample );
                for (i = 0; i < SINC_WIDTH / 2; ++i)
                {
                    temp1 = _mm_load_ps( (const float *)( kernel + i ) );
                    temp1 = _mm_mul_ps( temp1, samplex );
                    temp2 = _mm_loadu_ps( (const float *) out + i * 4 );
                    temp1 = _mm_add_ps( temp1, temp2 );
                    _mm_storeu_ps( (float *) out + i * 4, temp1 );
                }
            }
            
            if (inv_phase_inc.quad < 0x100000000ll)
            {
                ++in;
                inv_phase.quad += inv_phase_inc.quad;
                ADD_HI(out, inv_phase);
                CLEAR_HI(inv_phase);
            }
            else
            {
                phase.quad += phase_inc.quad;
                ++out;
                
                if (phase.quad >= 0x100000000ll)
                {
                    ++in;
                    CLEAR_HI(phase);
                }
            }
        }
        while ( in < in_end );

        r->phase = phase;
        r->inv_phase = inv_phase;
        r->last_amp = last_amp;
        *out_ = out;
        
        used = (int)(in - in_);
        
        r->write_filled -= used;
    }
    
    return used;
}